

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * SyOSHeapRealloc(void *pOld,sxu32 nByte)

{
  void *pvVar1;
  void *pNew;
  sxu32 nByte_local;
  void *pOld_local;
  
  pvVar1 = realloc(pOld,(ulong)nByte);
  return pvVar1;
}

Assistant:

static void * SyOSHeapRealloc(void *pOld, sxu32 nByte)
{
	void *pNew;
#if defined(__WINNT__)
	pNew = HeapReAlloc(GetProcessHeap(), 0, pOld, nByte);
#else
	pNew = realloc(pOld, (size_t)nByte);
#endif
	return pNew;	
}